

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

int SUNNonlinSolGetNumConvFails_FixedPoint(SUNNonlinearSolver NLS,long *nconvfails)

{
  if (NLS != (SUNNonlinearSolver)0x0) {
    *nconvfails = *(long *)((long)NLS->content + 0xa0);
    return 0;
  }
  return -0x385;
}

Assistant:

int SUNNonlinSolGetNumConvFails_FixedPoint(SUNNonlinearSolver NLS, long int *nconvfails)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* return the total number of nonlinear convergence failures */
  *nconvfails = FP_CONTENT(NLS)->nconvfails;
  return(SUN_NLS_SUCCESS);
}